

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrExternalCameraExtrinsicsOCULUS *value)

{
  bool bVar1;
  ValidateXrFlagsResult VVar2;
  string local_490 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_470;
  allocator local_451;
  string local_450 [32];
  string local_430 [32];
  ostringstream local_410 [8];
  ostringstream oss_enum_1;
  allocator local_291;
  string local_290 [39];
  allocator local_269;
  string local_268 [32];
  string local_248 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_228;
  allocator local_209;
  string local_208 [32];
  string local_1e8 [48];
  ostringstream local_1b8 [8];
  ostringstream oss_enum;
  ValidateXrFlagsResult external_camera_status_flags_oculus_result;
  XrResult xr_result;
  XrExternalCameraExtrinsicsOCULUS *value_local;
  bool check_pnext_local;
  bool check_members_local;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *objects_info_local;
  string *command_name_local;
  GenValidUsageXrInstanceInfo *instance_info_local;
  
  if (check_members) {
    VVar2 = ValidateXrExternalCameraStatusFlagsOCULUS(value->cameraStatusFlags);
    if (VVar2 == VALIDATE_XR_FLAGS_INVALID) {
      std::__cxx11::ostringstream::ostringstream(local_1b8);
      std::operator<<((ostream *)local_1b8,
                      "XrExternalCameraExtrinsicsOCULUS invalid member XrExternalCameraStatusFlagsOCULUS \"cameraStatusFlags\" flag value "
                     );
      Uint32ToHexString_abi_cxx11_((uint32_t)local_1e8);
      std::operator<<((ostream *)local_1b8,local_1e8);
      std::__cxx11::string::~string(local_1e8);
      std::operator<<((ostream *)local_1b8," contains illegal bit");
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_208,"VUID-XrExternalCameraExtrinsicsOCULUS-cameraStatusFlags-parameter",
                 &local_209);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_228,objects_info);
      std::__cxx11::ostringstream::str();
      CoreValidLogMessage(instance_info,(string *)local_208,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_228,local_248);
      std::__cxx11::string::~string((string *)local_248);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_228);
      std::__cxx11::string::~string(local_208);
      std::allocator<char>::~allocator((allocator<char> *)&local_209);
      instance_info_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      std::__cxx11::ostringstream::~ostringstream(local_1b8);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_268,"XrExternalCameraExtrinsicsOCULUS",&local_269);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_290,"attachedToDevice",&local_291);
      bVar1 = ValidateXrEnum(instance_info,command_name,(string *)local_268,(string *)local_290,
                             objects_info,value->attachedToDevice);
      std::__cxx11::string::~string(local_290);
      std::allocator<char>::~allocator((allocator<char> *)&local_291);
      std::__cxx11::string::~string(local_268);
      std::allocator<char>::~allocator((allocator<char> *)&local_269);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        instance_info_local._4_4_ = XR_SUCCESS;
      }
      else {
        std::__cxx11::ostringstream::ostringstream(local_410);
        std::operator<<((ostream *)local_410,
                        "XrExternalCameraExtrinsicsOCULUS contains invalid XrExternalCameraAttachedToDeviceOCULUS \"attachedToDevice\" enum value "
                       );
        Uint32ToHexString_abi_cxx11_((uint32_t)local_430);
        std::operator<<((ostream *)local_410,local_430);
        std::__cxx11::string::~string(local_430);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_450,"VUID-XrExternalCameraExtrinsicsOCULUS-attachedToDevice-parameter",
                   &local_451);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_470,objects_info);
        std::__cxx11::ostringstream::str();
        CoreValidLogMessage(instance_info,(string *)local_450,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                            command_name,&local_470,local_490);
        std::__cxx11::string::~string((string *)local_490);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                  (&local_470);
        std::__cxx11::string::~string(local_450);
        std::allocator<char>::~allocator((allocator<char> *)&local_451);
        instance_info_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
        std::__cxx11::ostringstream::~ostringstream(local_410);
      }
    }
  }
  else {
    instance_info_local._4_4_ = XR_SUCCESS;
  }
  return instance_info_local._4_4_;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrExternalCameraExtrinsicsOCULUS* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    ValidateXrFlagsResult external_camera_status_flags_oculus_result = ValidateXrExternalCameraStatusFlagsOCULUS(value->cameraStatusFlags);
    // Valid flags available, so it must be invalid to fail.
    if (VALIDATE_XR_FLAGS_INVALID == external_camera_status_flags_oculus_result) {
        // Otherwise, flags must be valid.
        std::ostringstream oss_enum;
        oss_enum << "XrExternalCameraExtrinsicsOCULUS invalid member XrExternalCameraStatusFlagsOCULUS \"cameraStatusFlags\" flag value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->cameraStatusFlags));
        oss_enum <<" contains illegal bit";
        CoreValidLogMessage(instance_info, "VUID-XrExternalCameraExtrinsicsOCULUS-cameraStatusFlags-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Make sure the enum type XrExternalCameraAttachedToDeviceOCULUS value is valid
    if (!ValidateXrEnum(instance_info, command_name, "XrExternalCameraExtrinsicsOCULUS", "attachedToDevice", objects_info, value->attachedToDevice)) {
        std::ostringstream oss_enum;
        oss_enum << "XrExternalCameraExtrinsicsOCULUS contains invalid XrExternalCameraAttachedToDeviceOCULUS \"attachedToDevice\" enum value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->attachedToDevice));
        CoreValidLogMessage(instance_info, "VUID-XrExternalCameraExtrinsicsOCULUS-attachedToDevice-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Everything checked out properly
    return xr_result;
}